

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManIncrSimStop(Gia_Man_t *p)

{
  Vec_Int_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  
  if (p->fIncrSim == 0) {
    __assert_fail("p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x48e,"void Gia_ManIncrSimStop(Gia_Man_t *)");
  }
  p->fIncrSim = 0;
  p->iPatsPi = 0;
  p->nSimWords = 0;
  p->iTimeStamp = 1;
  __ptr = p->vTimeStamps;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vTimeStamps->pArray = (int *)0x0;
      __ptr = p->vTimeStamps;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_00227347;
    }
    free(__ptr);
    p->vTimeStamps = (Vec_Int_t *)0x0;
  }
LAB_00227347:
  __ptr_00 = p->vSims;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vSims->pArray = (word *)0x0;
      __ptr_00 = p->vSims;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) {
        return;
      }
    }
    free(__ptr_00);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
  return;
}

Assistant:

void Gia_ManIncrSimStop( Gia_Man_t * p )
{
    assert( p->fIncrSim );
    p->fIncrSim   = 0;
    p->iPatsPi    = 0;
    p->nSimWords  = 0;
    p->iTimeStamp = 1;
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_WrdFreeP( &p->vSims );
}